

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::ReadWriteMemTask::checkArguments
          (ReadWriteMemTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  SourceRange sourceRange;
  SourceRange callRange;
  bool bVar1;
  SourceLocation this_00;
  Type *pTVar2;
  size_type sVar3;
  ASTContext *in_RCX;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDX;
  SourceLocation in_RSI;
  SystemSubroutine *in_RDI;
  SystemSubroutine *in_R8;
  SourceLocation in_R9;
  Type *indexType;
  Type *t;
  Compilation *comp;
  Type *pTVar4;
  Diagnostic *this_01;
  Type *in_stack_ffffffffffffff48;
  ASTContext *in_stack_ffffffffffffff58;
  SourceLocation in_stack_ffffffffffffff60;
  Expression *in_stack_ffffffffffffff70;
  ASTContext *in_stack_ffffffffffffff78;
  Args *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined1 isMethod;
  SystemSubroutine *min;
  Type *local_8;
  
  isMethod = (undefined1)((ulong)in_stack_ffffffffffffffa8 >> 0x38);
  min = in_RDI;
  this_00 = (SourceLocation)ASTContext::getCompilation((ASTContext *)0x99b041);
  pTVar4 = (Type *)0x2;
  this_01 = (Diagnostic *)0x4;
  callRange.endLoc = in_R9;
  callRange.startLoc = this_00;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_R8,in_RCX,(bool)isMethod,in_stack_ffffffffffffffa0,callRange,(size_t)min,
                     (size_t)in_RCX);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x99b0db);
    bVar1 = Type::canBeStringLike((Type *)this_01);
    if (bVar1) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,1);
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x99b142)
      ;
      bVar1 = Type::isUnpackedArray(pTVar4);
      if (bVar1) {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,1)
        ;
        not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0x99b1aa);
        do {
          bVar1 = Type::isAssociativeArray((Type *)0x99b1b9);
          if (((bVar1) && (pTVar2 = Type::getAssociativeIndexType(pTVar4), pTVar2 != (Type *)0x0))
             && (bVar1 = Type::isIntegral((Type *)this_01), !bVar1)) {
            std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                      (in_RDX,1);
            sourceRange.endLoc = in_RSI;
            sourceRange.startLoc = in_stack_ffffffffffffff60;
            ASTContext::addDiag(in_stack_ffffffffffffff58,
                                SUB84((ulong)in_stack_ffffffffffffff70 >> 0x20,0),sourceRange);
            Diagnostic::operator<<(this_01,(string *)pTVar4);
            pTVar4 = Compilation::getErrorType((Compilation *)this_00);
            return pTVar4;
          }
          Type::getArrayElementType(in_stack_ffffffffffffff48);
          bVar1 = Type::isUnpackedArray(pTVar4);
        } while (bVar1);
        bVar1 = Type::isIntegral((Type *)this_01);
        if (bVar1) {
          sVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                             0x99b2ec);
          if (2 < sVar3) {
            std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                      (in_RDX,2);
            not_null<const_slang::ast::Type_*>::operator->
                      ((not_null<const_slang::ast::Type_*> *)0x99b314);
            bVar1 = Type::isNumeric((Type *)this_01);
            if (!bVar1) {
              std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                        (in_RDX,2);
              pTVar4 = SystemSubroutine::badArg
                                 (in_RDI,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
              return pTVar4;
            }
            sVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                               0x99b36b);
            if (sVar3 == 4) {
              std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                        (in_RDX,3);
              not_null<const_slang::ast::Type_*>::operator->
                        ((not_null<const_slang::ast::Type_*> *)0x99b38f);
              bVar1 = Type::isNumeric((Type *)this_01);
              if (!bVar1) {
                std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                          (in_RDX,3);
                pTVar4 = SystemSubroutine::badArg
                                   (in_RDI,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
                return pTVar4;
              }
            }
          }
          local_8 = Compilation::getVoidType((Compilation *)this_00);
        }
        else {
          std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                    (in_RDX,1);
          local_8 = SystemSubroutine::badArg
                              (in_RDI,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
        }
      }
      else {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,1)
        ;
        local_8 = SystemSubroutine::badArg(in_RDI,in_stack_ffffffffffffff78,(Expression *)in_RSI);
      }
    }
    else {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
      local_8 = SystemSubroutine::badArg(in_RDI,(ASTContext *)in_RSI,in_stack_ffffffffffffff70);
    }
  }
  else {
    local_8 = Compilation::getErrorType((Compilation *)this_00);
  }
  return local_8;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 2, 4))
            return comp.getErrorType();

        if (!args[0]->type->canBeStringLike())
            return badArg(context, *args[0]);

        if (!args[1]->type->isUnpackedArray())
            return badArg(context, *args[1]);

        const Type* t = args[1]->type;
        do {
            if (t->isAssociativeArray()) {
                auto indexType = t->getAssociativeIndexType();
                if (indexType && !indexType->isIntegral()) {
                    context.addDiag(diag::QueryOnAssociativeNonIntegral, args[1]->sourceRange)
                        << name;
                    return comp.getErrorType();
                }
            }
            t = t->getArrayElementType();
        } while (t->isUnpackedArray());

        if (!t->isIntegral())
            return badArg(context, *args[1]);

        if (args.size() >= 3) {
            if (!args[2]->type->isNumeric())
                return badArg(context, *args[2]);

            if (args.size() == 4) {
                if (!args[3]->type->isNumeric())
                    return badArg(context, *args[3]);
            }
        }

        return comp.getVoidType();
    }